

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O1

int __thiscall crnlib::task_pool::init(task_pool *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  uint uVar2;
  undefined8 unaff_R13;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = 0x40;
  if ((uint)ctx < 0x40) {
    uVar2 = (uint)ctx;
  }
  deinit(this);
  this->m_num_threads = 0;
  uVar3 = CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
  while (this->m_num_threads < uVar2) {
    uVar4 = 0;
    iVar1 = pthread_create(this->m_threads + this->m_num_threads,(pthread_attr_t *)0x0,thread_func,
                           this);
    if (iVar1 != 0) goto LAB_0015b358;
    this->m_num_threads = this->m_num_threads + 1;
    uVar3 = uVar3 & 0xffffffff;
  }
  uVar4 = uVar3 & 0xffffffff;
LAB_0015b358:
  if ((uVar4 & 1) == 0) {
    deinit(this);
  }
  return (int)uVar4;
}

Assistant:

bool task_pool::init(uint num_threads) {
  CRNLIB_ASSERT(num_threads <= cMaxThreads);
  num_threads = math::minimum<uint>(num_threads, cMaxThreads);

  deinit();

  bool succeeded = true;

  m_num_threads = 0;
  while (m_num_threads < num_threads) {
    int status = pthread_create(&m_threads[m_num_threads], NULL, thread_func, this);
    if (status) {
      succeeded = false;
      break;
    }

    m_num_threads++;
  }

  if (!succeeded) {
    deinit();
    return false;
  }

  return true;
}